

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O2

void __thiscall Paragraph::~Paragraph(Paragraph *this)

{
  TextElement::~TextElement(&this->super_TextElement);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Paragraph(std::string text)
		:	TextElement{std::move(text)}
	{}